

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O3

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *
OnDiskDataset::get_compact_candidates
          (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
           *__return_storage_ptr__,
          vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  pointer *pppOVar1;
  pointer ppOVar2;
  OnDiskDataset *pOVar3;
  pointer pOVar4;
  OnDiskDataset *pOVar5;
  iterator iVar6;
  long lVar7;
  ulong uVar8;
  OnDiskDataset **ppOVar9;
  ulong uVar10;
  pointer ppOVar11;
  ulong uVar12;
  uint uVar13;
  OnDiskDataset **ppOVar14;
  OnDiskDataset *pOVar15;
  OnDiskDataset **ppOVar16;
  pointer pOVar17;
  ulong uVar18;
  bool bVar19;
  path __result;
  OnDiskDataset **local_128;
  OnDiskDataset **local_120;
  OnDiskDataset **local_110;
  path local_f0;
  path local_b0;
  path local_70;
  
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppOVar11 = (datasets->
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppOVar2 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)ppOVar2 - (long)ppOVar11)) {
    if (ppOVar11 == ppOVar2) {
      local_128 = (OnDiskDataset **)0x0;
      local_110 = (OnDiskDataset **)0x0;
      local_120 = (OnDiskDataset **)0x0;
    }
    else {
      local_128 = (OnDiskDataset **)0x0;
      local_110 = (OnDiskDataset **)0x0;
      local_120 = (OnDiskDataset **)0x0;
      do {
        pOVar3 = *ppOVar11;
        pOVar17 = (pOVar3->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pOVar4 = (pOVar3->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pOVar17 == pOVar4) {
          pOVar15 = (OnDiskDataset *)0x0;
        }
        else {
          pOVar15 = (OnDiskDataset *)0x0;
          do {
            std::experimental::filesystem::v1::__cxx11::path::path(&local_f0,&pOVar3->db_base);
            std::experimental::filesystem::v1::__cxx11::path::
            path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                      (&local_b0,&pOVar17->fname);
            std::experimental::filesystem::v1::__cxx11::path::path(&local_70,&local_f0);
            std::experimental::filesystem::v1::__cxx11::path::_M_append
                      (&local_70,&local_b0._M_pathname);
            lVar7 = std::experimental::filesystem::v1::file_size(&local_70);
            pOVar15 = (OnDiskDataset *)((long)&(pOVar15->name)._M_dataplus._M_p + lVar7);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_f0);
            pOVar17 = pOVar17 + 1;
          } while (pOVar17 != pOVar4);
        }
        if (local_110 == local_120) {
          uVar10 = (long)local_110 - (long)local_128;
          if (uVar10 == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar8 = (long)uVar10 >> 4;
          uVar12 = uVar8;
          if (local_110 == local_128) {
            uVar12 = 1;
          }
          uVar18 = uVar12 + uVar8;
          if (0x7fffffffffffffe < uVar18) {
            uVar18 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar12,uVar8)) {
            uVar18 = 0x7ffffffffffffff;
          }
          ppOVar9 = (OnDiskDataset **)operator_new(uVar18 * 0x10);
          *(OnDiskDataset **)((long)ppOVar9 + uVar10) = pOVar3;
          *(OnDiskDataset **)((long)ppOVar9 + uVar10 + 8) = pOVar15;
          ppOVar16 = ppOVar9;
          for (ppOVar14 = local_128; local_110 != ppOVar14; ppOVar14 = ppOVar14 + 2) {
            pOVar3 = ppOVar14[1];
            *ppOVar16 = *ppOVar14;
            ppOVar16[1] = pOVar3;
            ppOVar16 = ppOVar16 + 2;
          }
          if (local_128 != (OnDiskDataset **)0x0) {
            operator_delete(local_128,uVar10);
          }
          local_120 = ppOVar9 + uVar18 * 2;
          local_128 = ppOVar9;
        }
        else {
          *local_110 = pOVar3;
          local_110[1] = pOVar15;
          ppOVar16 = local_110;
        }
        local_110 = ppOVar16 + 2;
        ppOVar11 = ppOVar11 + 1;
      } while (ppOVar11 != ppOVar2);
      if (local_128 != local_110) {
        uVar10 = (long)local_110 - (long)local_128 >> 4;
        lVar7 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                  (local_128,local_110,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)local_110 - (long)local_128 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                    (local_128,local_110);
        }
        else {
          ppOVar14 = local_128 + 0x20;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                    (local_128,ppOVar14);
          if (ppOVar14 != local_110) {
            do {
              pOVar3 = *ppOVar14;
              pOVar15 = ppOVar14[1];
              pOVar5 = ppOVar14[-1];
              ppOVar9 = ppOVar14;
              while (pOVar15 < pOVar5) {
                *ppOVar9 = ppOVar9[-2];
                ppOVar9[1] = ppOVar9[-1];
                pOVar5 = ppOVar9[-3];
                ppOVar9 = ppOVar9 + -2;
              }
              *ppOVar9 = pOVar3;
              ppOVar9[1] = pOVar15;
              bVar19 = ppOVar14 != ppOVar16;
              ppOVar14 = ppOVar14 + 2;
            } while (bVar19);
          }
        }
      }
    }
    iVar6._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
      _M_realloc_insert<OnDiskDataset_const*const&>
                ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                 __return_storage_ptr__,iVar6,local_128);
    }
    else {
      *iVar6._M_current = *local_128;
      (__return_storage_ptr__->
      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    uVar10 = (long)local_110 - (long)local_128 >> 4;
    if (1 < uVar10) {
      uVar12 = 1;
      uVar13 = 2;
      do {
        if ((OnDiskDataset *)((long)local_128[(ulong)(uVar13 - 2) * 2 + 1] * 2) <=
            local_128[uVar12 * 2 + 1]) break;
        iVar6._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
          _M_realloc_insert<OnDiskDataset_const*const&>
                    ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                     __return_storage_ptr__,iVar6,local_128 + uVar12 * 2);
        }
        else {
          *iVar6._M_current = local_128[uVar12 * 2];
          pppOVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppOVar1 = *pppOVar1 + 1;
        }
        uVar12 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar12 < uVar10);
    }
    ppOVar11 = (__return_storage_ptr__->
               super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (__return_storage_ptr__->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppOVar2 - (long)ppOVar11) < 9 && ppOVar2 != ppOVar11) {
      (__return_storage_ptr__->
      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppOVar11;
    }
    if (local_128 != (OnDiskDataset **)0x0) {
      operator_delete(local_128,(long)local_120 - (long)local_128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}